

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.h
# Opt level: O1

Error __thiscall llvm::ErrorList::join(ErrorList *this,Error *E1,Error *E2)

{
  unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_> *puVar1;
  const_iterator __position;
  char cVar2;
  ulong uVar3;
  ErrorList *this_00;
  _func_int **pp_Var4;
  pointer *__ptr;
  long *plVar5;
  pointer __p;
  _Head_base<0UL,_llvm::ErrorInfoBase_*,_false> _Var6;
  unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_> *Payload;
  unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_> *__args;
  unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_> Tmp_2;
  unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_> Tmp;
  unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_> Tmp_3;
  _Head_base<0UL,_llvm::ErrorInfoBase_*,_false> local_48;
  _Head_base<0UL,_llvm::ErrorInfoBase_*,_false> local_40;
  _Head_base<0UL,_llvm::ErrorInfoBase_*,_false> local_38;
  
  uVar3 = (ulong)E1->Payload & 0xfffffffffffffffe;
  E1->Payload = (ErrorInfoBase *)(uVar3 != 0 | uVar3);
  if (uVar3 == 0) {
LAB_0015519b:
    (this->super_ErrorInfo<llvm::ErrorList,_llvm::ErrorInfoBase>).super_ErrorInfoBase.
    _vptr_ErrorInfoBase = (_func_int **)0x0;
    (this->super_ErrorInfo<llvm::ErrorList,_llvm::ErrorInfoBase>).super_ErrorInfoBase.
    _vptr_ErrorInfoBase = (_func_int **)((ulong)E2->Payload | 1);
    E2->Payload = (ErrorInfoBase *)0x0;
    return (Error)(ErrorInfoBase *)this;
  }
  uVar3 = (ulong)E2->Payload & 0xfffffffffffffffe;
  E2->Payload = (ErrorInfoBase *)(uVar3 != 0 | uVar3);
  if (uVar3 == 0) goto LAB_00155268;
  plVar5 = (long *)((ulong)E1->Payload & 0xfffffffffffffffe);
  if ((plVar5 == (long *)0x0) || (cVar2 = (**(code **)(*plVar5 + 0x30))(plVar5,&ID), cVar2 == '\0'))
  {
    plVar5 = (long *)((ulong)E2->Payload & 0xfffffffffffffffe);
    if ((plVar5 == (long *)0x0) ||
       (cVar2 = (**(code **)(*plVar5 + 0x30))(plVar5,&ID), cVar2 == '\0')) {
      this_00 = (ErrorList *)operator_new(0x20);
      local_48._M_head_impl = (ErrorInfoBase *)((ulong)E1->Payload & 0xfffffffffffffffe);
      E1->Payload = (ErrorInfoBase *)0x0;
      local_38._M_head_impl = (ErrorInfoBase *)((ulong)E2->Payload & 0xfffffffffffffffe);
      E2->Payload = (ErrorInfoBase *)0x0;
      ErrorList(this_00,(unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>
                         *)&local_48,
                (unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_> *)
                &local_38);
      local_40._M_head_impl = (ErrorInfoBase *)0x0;
      (this->super_ErrorInfo<llvm::ErrorList,_llvm::ErrorInfoBase>).super_ErrorInfoBase.
      _vptr_ErrorInfoBase = (_func_int **)((ulong)this_00 | 1);
      std::unique_ptr<llvm::ErrorList,_std::default_delete<llvm::ErrorList>_>::~unique_ptr
                ((unique_ptr<llvm::ErrorList,_std::default_delete<llvm::ErrorList>_> *)&local_40);
      if (local_38._M_head_impl != (ErrorInfoBase *)0x0) {
        (*(local_38._M_head_impl)->_vptr_ErrorInfoBase[1])();
      }
      local_38._M_head_impl = (ErrorInfoBase *)0x0;
      if (local_48._M_head_impl == (ErrorInfoBase *)0x0) {
        return (Error)(ErrorInfoBase *)this;
      }
      (*(local_48._M_head_impl)->_vptr_ErrorInfoBase[1])();
      return (Error)(ErrorInfoBase *)this;
    }
    uVar3 = (ulong)E2->Payload & 0xfffffffffffffffe;
    __position._M_current =
         *(unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_> **)(uVar3 + 8)
    ;
    local_40._M_head_impl = (ErrorInfoBase *)((ulong)E1->Payload & 0xfffffffffffffffe);
    E1->Payload = (ErrorInfoBase *)0x0;
    std::
    vector<std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>,_std::allocator<std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>_>_>
    ::_M_insert_rval((vector<std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>,_std::allocator<std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>_>_>
                      *)(uVar3 + 8),__position,(value_type *)&local_40);
    if (local_40._M_head_impl != (ErrorInfoBase *)0x0) {
      (*(local_40._M_head_impl)->_vptr_ErrorInfoBase[1])();
    }
    goto LAB_0015519b;
  }
  uVar3 = (ulong)E1->Payload & 0xfffffffffffffffe;
  plVar5 = (long *)((ulong)E2->Payload & 0xfffffffffffffffe);
  if ((plVar5 == (long *)0x0) || (cVar2 = (**(code **)(*plVar5 + 0x30))(plVar5,&ID), cVar2 == '\0'))
  {
    local_40._M_head_impl = (ErrorInfoBase *)((ulong)E2->Payload & 0xfffffffffffffffe);
    E2->Payload = (ErrorInfoBase *)0x0;
    std::
    vector<std::unique_ptr<llvm::ErrorInfoBase,std::default_delete<llvm::ErrorInfoBase>>,std::allocator<std::unique_ptr<llvm::ErrorInfoBase,std::default_delete<llvm::ErrorInfoBase>>>>
    ::emplace_back<std::unique_ptr<llvm::ErrorInfoBase,std::default_delete<llvm::ErrorInfoBase>>>
              ((vector<std::unique_ptr<llvm::ErrorInfoBase,std::default_delete<llvm::ErrorInfoBase>>,std::allocator<std::unique_ptr<llvm::ErrorInfoBase,std::default_delete<llvm::ErrorInfoBase>>>>
                *)(uVar3 + 8),
               (unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_> *)
               &local_40);
    if (local_40._M_head_impl == (ErrorInfoBase *)0x0) goto LAB_00155268;
    pp_Var4 = (local_40._M_head_impl)->_vptr_ErrorInfoBase;
    _Var6._M_head_impl = local_40._M_head_impl;
  }
  else {
    _Var6._M_head_impl = (ErrorInfoBase *)((ulong)E2->Payload & 0xfffffffffffffffe);
    E2->Payload = (ErrorInfoBase *)0x0;
    __args = (unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_> *)
             _Var6._M_head_impl[1]._vptr_ErrorInfoBase;
    puVar1 = (unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_> *)
             _Var6._M_head_impl[2]._vptr_ErrorInfoBase;
    if (__args != puVar1) {
      do {
        std::
        vector<std::unique_ptr<llvm::ErrorInfoBase,std::default_delete<llvm::ErrorInfoBase>>,std::allocator<std::unique_ptr<llvm::ErrorInfoBase,std::default_delete<llvm::ErrorInfoBase>>>>
        ::
        emplace_back<std::unique_ptr<llvm::ErrorInfoBase,std::default_delete<llvm::ErrorInfoBase>>>
                  ((vector<std::unique_ptr<llvm::ErrorInfoBase,std::default_delete<llvm::ErrorInfoBase>>,std::allocator<std::unique_ptr<llvm::ErrorInfoBase,std::default_delete<llvm::ErrorInfoBase>>>>
                    *)(uVar3 + 8),__args);
        __args = __args + 1;
      } while (__args != puVar1);
    }
    if (_Var6._M_head_impl == (ErrorInfoBase *)0x0) goto LAB_00155268;
    pp_Var4 = (_Var6._M_head_impl)->_vptr_ErrorInfoBase;
  }
  (*pp_Var4[1])(_Var6._M_head_impl);
LAB_00155268:
  (this->super_ErrorInfo<llvm::ErrorList,_llvm::ErrorInfoBase>).super_ErrorInfoBase.
  _vptr_ErrorInfoBase = (_func_int **)0x0;
  (this->super_ErrorInfo<llvm::ErrorList,_llvm::ErrorInfoBase>).super_ErrorInfoBase.
  _vptr_ErrorInfoBase = (_func_int **)((ulong)E1->Payload | 1);
  E1->Payload = (ErrorInfoBase *)0x0;
  return (Error)(ErrorInfoBase *)this;
}

Assistant:

static Error join(Error E1, Error E2) {
    if (!E1)
      return E2;
    if (!E2)
      return E1;
    if (E1.isA<ErrorList>()) {
      auto &E1List = static_cast<ErrorList &>(*E1.getPtr());
      if (E2.isA<ErrorList>()) {
        auto E2Payload = E2.takePayload();
        auto &E2List = static_cast<ErrorList &>(*E2Payload);
        for (auto &Payload : E2List.Payloads)
          E1List.Payloads.push_back(std::move(Payload));
      } else
        E1List.Payloads.push_back(E2.takePayload());

      return E1;
    }
    if (E2.isA<ErrorList>()) {
      auto &E2List = static_cast<ErrorList &>(*E2.getPtr());
      E2List.Payloads.insert(E2List.Payloads.begin(), E1.takePayload());
      return E2;
    }
    return Error(std::unique_ptr<ErrorList>(
        new ErrorList(E1.takePayload(), E2.takePayload())));
  }